

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameconfigfile.cpp
# Opt level: O1

void __thiscall
FGameConfigFile::CreateStandardAutoExec(FGameConfigFile *this,char *section,bool start)

{
  bool bVar1;
  FString path;
  FString local_20;
  
  bVar1 = FConfigFile::SetSection(&this->super_FConfigFile,section,false);
  if (!bVar1) {
    M_GetAutoexecPath();
    FConfigFile::SetSection(&this->super_FConfigFile,section,true);
    FConfigFile::SetValueForKey(&this->super_FConfigFile,"Path",local_20.Chars,false);
    FString::~FString(&local_20);
  }
  if (start) {
    FConfigFile::MoveSectionToStart(&this->super_FConfigFile,section);
  }
  return;
}

Assistant:

void FGameConfigFile::CreateStandardAutoExec(const char *section, bool start)
{
	if (!SetSection(section))
	{
		FString path = M_GetAutoexecPath();
		SetSection (section, true);
		SetValueForKey ("Path", path.GetChars());
	}
	if (start)
	{
		MoveSectionToStart(section);
	}
}